

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O2

int __thiscall particleSamples::read_in_particle_samples_UrQMD_binary(particleSamples *this)

{
  ifstream *piVar1;
  vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
  *this_00;
  ostream *poVar2;
  particleSamples *ppVar3;
  int urqmd_isospin;
  int i;
  int iVar4;
  long lVar5;
  int i_1;
  bool bVar6;
  allocator local_1b5;
  int n_particle;
  ostream *local_1b0;
  int local_1a4;
  long local_1a0;
  particleSamples *local_198;
  int local_18c;
  float particle_array [9];
  int idummy;
  undefined4 uStack_15c;
  double local_158;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [48];
  int info_array [6];
  string temp_string;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  clear_out_previous_record(this,this->full_particle_list);
  temp_string._M_dataplus._M_p = (pointer)&temp_string.field_2;
  temp_string._M_string_length = 0;
  temp_string.field_2._M_local_buf[0] = '\0';
  n_particle = 0;
  piVar1 = &this->inputfile;
  local_1b0 = (ostream *)&this->messager;
  local_1a0 = 0;
  local_198 = this;
  for (local_18c = 0; ppVar3 = local_198, local_18c < local_198->event_buffer_size;
      local_18c = local_18c + n_particle) {
    std::istream::read((char *)piVar1,(long)&n_particle);
    if (((&ppVar3->field_0x1e8)[*(long *)(*(long *)&ppVar3->inputfile + -0x18)] & 2) != 0) break;
    this_00 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
               *)ppVar3->full_particle_list;
    _idummy = (undefined8 *)operator_new(0x18);
    *_idummy = 0;
    _idummy[1] = 0;
    _idummy[2] = 0;
    std::
    vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
    ::emplace_back<std::vector<particle_info,std::allocator<particle_info>>*>
              (this_00,(vector<particle_info,_std::allocator<particle_info>_> **)&idummy);
    iVar4 = 8;
    while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
      _idummy = (undefined8 *)((ulong)_idummy & 0xffffffff00000000);
      std::istream::read((char *)piVar1,(long)&idummy);
    }
    iVar4 = 0;
    while (iVar4 < n_particle) {
      local_1a4 = iVar4;
      for (lVar5 = 0; urqmd_isospin = info_array[1], iVar4 = info_array[0], lVar5 != 6;
          lVar5 = lVar5 + 1) {
        std::istream::read((char *)piVar1,(long)&idummy);
        info_array[lVar5] = idummy;
      }
      for (lVar5 = 0; lVar5 != 9; lVar5 = lVar5 + 1) {
        std::istream::read((char *)piVar1,(long)&idummy);
        particle_array[lVar5] = (float)idummy;
      }
      iVar4 = get_pdg_id(local_198,iVar4,urqmd_isospin);
      poVar2 = local_1b0;
      _idummy = (undefined8 *)CONCAT44(uStack_15c,iVar4);
      local_158 = (double)particle_array[0];
      local_128._8_4_ = SUB84((double)SUB84(particle_array._8_8_,4),0);
      local_128._0_8_ = (double)(float)particle_array._8_8_;
      local_128._12_4_ = (int)((ulong)(double)SUB84(particle_array._8_8_,4) >> 0x20);
      local_118._8_4_ = SUB84((double)particle_array[1],0);
      local_118._0_8_ = (double)particle_array[4];
      local_118._12_4_ = (int)((ulong)(double)particle_array[1] >> 0x20);
      local_148._8_4_ = SUB84((double)SUB84(particle_array._24_8_,4),0);
      local_148._0_8_ = (double)(float)particle_array._24_8_;
      local_148._12_4_ = (int)((ulong)(double)SUB84(particle_array._24_8_,4) >> 0x20);
      local_138._8_4_ = SUB84((double)particle_array[5],0);
      local_138._0_8_ = (double)particle_array[8];
      local_138._12_4_ = (int)((ulong)(double)particle_array[5] >> 0x20);
      if (iVar4 == 0) {
        std::operator<<(local_1b0,"nev = ");
        std::ostream::operator<<(poVar2,(int)local_1a0);
        std::__cxx11::string::string((string *)&local_50,"error",&local_1b5);
        poVar2 = local_1b0;
        pretty_ostream::flush((pretty_ostream *)local_1b0,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::operator<<(poVar2,"nparticles = ");
        std::ostream::operator<<(poVar2,n_particle);
        std::operator<<(poVar2,", ipart = ");
        std::ostream::operator<<(poVar2,local_1a4);
        std::__cxx11::string::string((string *)&local_70,"error",&local_1b5);
        poVar2 = local_1b0;
        pretty_ostream::flush((pretty_ostream *)local_1b0,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::operator<<(poVar2,"mass = ");
        std::ostream::_M_insert<double>(local_158);
        std::operator<<(poVar2,", E = ");
        std::ostream::_M_insert<double>((double)local_138._8_8_);
        std::operator<<(poVar2,", px = ");
        std::ostream::_M_insert<double>((double)local_148._0_8_);
        std::operator<<(poVar2,", py = ");
        std::ostream::_M_insert<double>((double)local_148._8_8_);
        std::operator<<(poVar2,", pz = ");
        std::ostream::_M_insert<double>((double)local_138._0_8_);
        std::operator<<(poVar2,", t = ");
        std::ostream::_M_insert<double>((double)local_118._8_8_);
        std::operator<<(poVar2,", x = ");
        std::ostream::_M_insert<double>((double)local_128._0_8_);
        std::operator<<(poVar2,", y = ");
        std::ostream::_M_insert<double>((double)local_128._8_8_);
        std::operator<<(poVar2,", z = ");
        std::ostream::_M_insert<double>((double)local_118._0_8_);
        std::__cxx11::string::string((string *)&local_90,"error",&local_1b5);
        poVar2 = local_1b0;
        pretty_ostream::flush((pretty_ostream *)local_1b0,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::operator<<(poVar2,"Ignore this particle!");
        std::__cxx11::string::string((string *)&local_b0,"error",&local_1b5);
        pretty_ostream::flush((pretty_ostream *)local_1b0,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      else {
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  ((local_198->full_particle_list->
                   super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[local_1a0],(value_type *)&idummy);
      }
      iVar4 = local_1a4 + 1;
    }
    local_1a0 = local_1a0 + 1;
  }
  std::__cxx11::string::~string((string *)&temp_string);
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_UrQMD_binary() {
    // clean out the previous record
    clear_out_previous_record(full_particle_list);

    std::string temp_string;
    int n_particle = 0;
    int ievent = 0;
    int urqmd_pid, urqmd_iso3;
    int num_particles = 0;
    while (num_particles < event_buffer_size) {
        inputfile.read(reinterpret_cast<char *>(&n_particle), sizeof(int));
        if (inputfile.eof()) break;

        full_particle_list->push_back(new vector<particle_info>);

        // then get one useless line
        for (int i = 0; i < 8; i++) {
            int idummy = 0;
            inputfile.read(reinterpret_cast<char *>(&idummy), sizeof(int));
        }

        // std::cout << "n_particle = " << n_particle << std::endl;
        for (int ipart = 0; ipart < n_particle; ipart++) {
            int info_array[6];
            for (int i = 0; i < 6; i++) {
                int temp;
                inputfile.read(reinterpret_cast<char *>(&temp), sizeof(int));
                info_array[i] = temp;
            }
            urqmd_pid = info_array[0];
            urqmd_iso3 = info_array[1];

            float particle_array[9];
            for (int i = 0; i < 9; i++) {
                float temp;
                inputfile.read(reinterpret_cast<char *>(&temp), sizeof(float));
                particle_array[i] = temp;
            }

            particle_info temp_particle_info;
            temp_particle_info.monval = get_pdg_id(urqmd_pid, urqmd_iso3);
            temp_particle_info.mass = particle_array[0];
            temp_particle_info.t = particle_array[1];
            temp_particle_info.x = particle_array[2];
            temp_particle_info.y = particle_array[3];
            temp_particle_info.z = particle_array[4];
            temp_particle_info.E = particle_array[5];
            temp_particle_info.px = particle_array[6];
            temp_particle_info.py = particle_array[7];
            temp_particle_info.pz = particle_array[8];
            if (temp_particle_info.monval == 0) {
                messager << "nev = " << ievent;
                messager.flush("error");
                messager << "nparticles = " << n_particle
                         << ", ipart = " << ipart;
                messager.flush("error");
                messager << "mass = " << temp_particle_info.mass
                         << ", E = " << temp_particle_info.E
                         << ", px = " << temp_particle_info.px
                         << ", py = " << temp_particle_info.py
                         << ", pz = " << temp_particle_info.pz
                         << ", t = " << temp_particle_info.t
                         << ", x = " << temp_particle_info.x
                         << ", y = " << temp_particle_info.y
                         << ", z = " << temp_particle_info.z;
                messager.flush("error");
                messager << "Ignore this particle!";
                messager.flush("error");
            } else {
                (*full_particle_list)[ievent]->push_back(temp_particle_info);
            }
        }
        num_particles += n_particle;
        ievent++;
    }
    return (0);
}